

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

IntrusiveList<SynCallArgument> ParseCallArguments(ParseContext *ctx)

{
  bool bVar1;
  SynCallArgument *pSVar2;
  Lexeme *pLVar3;
  Lexeme *end;
  SynBase *value;
  Lexeme *begin;
  Lexeme *end_00;
  bool bVar4;
  bool namedCall;
  SynCallArgument *argument;
  ParseContext *ctx_local;
  IntrusiveList<SynCallArgument> arguments;
  
  IntrusiveList<SynCallArgument>::IntrusiveList((IntrusiveList<SynCallArgument> *)&ctx_local);
  pSVar2 = ParseCallArgument(ctx);
  if (pSVar2 != (SynCallArgument *)0x0) {
    IntrusiveList<SynCallArgument>::push_back((IntrusiveList<SynCallArgument> *)&ctx_local,pSVar2);
    bVar4 = pSVar2->name != (SynIdentifier *)0x0;
    while (bVar1 = ParseContext::Consume(ctx,lex_comma), bVar1) {
      pSVar2 = ParseCallArgument(ctx);
      if (pSVar2 == (SynCallArgument *)0x0) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report
                  (ctx,pLVar3,"ERROR: expression not found after \',\' in function argument list");
        pSVar2 = ParseContext::get<SynCallArgument>(ctx);
        pLVar3 = ParseContext::Current(ctx);
        end = ParseContext::Current(ctx);
        value = &ParseContext::get<SynError>(ctx)->super_SynBase;
        begin = ParseContext::Current(ctx);
        end_00 = ParseContext::Current(ctx);
        SynError::SynError((SynError *)value,begin,end_00);
        SynCallArgument::SynCallArgument(pSVar2,pLVar3,end,(SynIdentifier *)0x0,value);
        IntrusiveList<SynCallArgument>::push_back
                  ((IntrusiveList<SynCallArgument> *)&ctx_local,pSVar2);
        return _ctx_local;
      }
      if ((bVar4) && (pSVar2->name == (SynIdentifier *)0x0)) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report
                  (ctx,pLVar3,"ERROR: function argument name expected after \',\'");
        return _ctx_local;
      }
      bVar4 = bVar4 || pSVar2->name != (SynIdentifier *)0x0;
      IntrusiveList<SynCallArgument>::push_back((IntrusiveList<SynCallArgument> *)&ctx_local,pSVar2)
      ;
    }
  }
  return _ctx_local;
}

Assistant:

IntrusiveList<SynCallArgument> ParseCallArguments(ParseContext &ctx)
{
	IntrusiveList<SynCallArgument> arguments;

	if(SynCallArgument *argument = ParseCallArgument(ctx))
	{
		arguments.push_back(argument);

		bool namedCall = argument->name != NULL;

		while(ctx.Consume(lex_comma))
		{
			argument = ParseCallArgument(ctx);

			if(!argument)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ',' in function argument list");

				arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(ctx.Current(), ctx.Current(), NULL, new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current())));
				break;
			}

			if(namedCall && !argument->name)
			{
				Report(ctx, ctx.Current(), "ERROR: function argument name expected after ','");

				break;
			}

			namedCall |= argument->name != NULL;

			arguments.push_back(argument);
		}
	}

	return arguments;
}